

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::MakeNamedMedium
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_RDX;
  long in_RDI;
  ParameterDictionary dict;
  char *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *other;
  RGBColorSpace *colorSpace;
  int extra;
  FormattingScene *in_stack_fffffffffffffe88;
  ParameterDictionary *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  string local_158 [32];
  string local_138 [12];
  int in_stack_fffffffffffffed4;
  ParameterDictionary *in_stack_fffffffffffffed8;
  string local_118 [48];
  undefined1 local_e8 [232];
  
  other = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           *)local_e8;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  colorSpace = (RGBColorSpace *)(local_e8 + 8);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)colorSpace,other,in_RDX);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffe90,(ParsedParameterVector *)in_stack_fffffffffffffe88,colorSpace
            );
  extra = (int)((ulong)colorSpace >> 0x20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  if (((*(byte *)(in_RDI + 0x11) & 1) == 0) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                              in_stack_fffffffffffffe58), !bVar1)) {
    indent_abi_cxx11_(in_stack_fffffffffffffe88,extra);
    ParameterDictionary::ToParameterList_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
    std::__cxx11::string::~string(local_158);
  }
  else {
    indent_abi_cxx11_(in_stack_fffffffffffffe88,extra);
    ParameterDictionary::ToParameterList_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    Printf<std::__cxx11::string,char_const(&)[12],std::__cxx11::string>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (char (*) [12])in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_118);
  }
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9d501f);
  return;
}

Assistant:

void FormattingScene::MakeNamedMedium(const std::string &name,
                                      ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade && name == "heterogeneous")
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), "uniformgrid",
               dict.ToParameterList(catIndentCount));
    else
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), name,
               dict.ToParameterList(catIndentCount));
}